

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void __thiscall
cmDependsFortran::cmDependsFortran(cmDependsFortran *this,cmLocalUnixMakefileGenerator3 *lg)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  pointer pbVar2;
  cmDependsFortranInternals *this_01;
  long lVar3;
  pointer pbVar4;
  string def;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definitions;
  allocator<char> local_70 [32];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",(allocator<char> *)&def)
  ;
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_007d6f90;
  (this->SourceFile)._M_dataplus._M_p = (pointer)&(this->SourceFile).field_2;
  (this->SourceFile)._M_string_length = 0;
  (this->SourceFile).field_2._M_local_buf[0] = '\0';
  (this->CompilerId)._M_dataplus._M_p = (pointer)&(this->CompilerId).field_2;
  (this->CompilerId)._M_string_length = 0;
  (this->CompilerId).field_2._M_local_buf[0] = '\0';
  (this->SModSep)._M_dataplus._M_p = (pointer)&(this->SModSep).field_2;
  (this->SModSep)._M_string_length = 0;
  (this->SModSep).field_2._M_local_buf[0] = '\0';
  (this->SModExt)._M_dataplus._M_p = (pointer)&(this->SModExt).field_2;
  (this->SModExt)._M_string_length = 0;
  (this->SModExt).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PPDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_01 = (cmDependsFortranInternals *)operator_new(0x90);
  cmDependsFortranInternals::cmDependsFortranInternals(this_01);
  (this->Internal)._M_t.
  super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
  .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl = this_01;
  std::__cxx11::string::string<std::allocator<char>>((string *)&def,"Fortran",local_70);
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,&def);
  std::__cxx11::string::~string((string *)&def);
  definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  definitions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
            super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"CMAKE_TARGET_DEFINITIONS_Fortran",local_70);
  cmMakefile::GetDefExpandList(this_00,&def,&definitions,false);
  std::__cxx11::string::~string((string *)&def);
  pbVar2 = definitions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = definitions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar2; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string((string *)&def,(string *)pbVar4);
    lVar3 = std::__cxx11::string::find((char)&def,0x3d);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_70,(ulong)&def);
      std::__cxx11::string::operator=((string *)&def,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->PPDefinitions,&def);
    std::__cxx11::string::~string((string *)&def);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"CMAKE_Fortran_COMPILER_ID",local_70);
  cmMakefile::GetSafeDefinition(this_00,&def);
  std::__cxx11::string::_M_assign((string *)&this->CompilerId);
  std::__cxx11::string::~string((string *)&def);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"CMAKE_Fortran_SUBMODULE_SEP",local_70);
  cmMakefile::GetSafeDefinition(this_00,&def);
  std::__cxx11::string::_M_assign((string *)&this->SModSep);
  std::__cxx11::string::~string((string *)&def);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&def,"CMAKE_Fortran_SUBMODULE_EXT",local_70);
  cmMakefile::GetSafeDefinition(this_00,&def);
  std::__cxx11::string::_M_assign((string *)&this->SModExt);
  std::__cxx11::string::~string((string *)&def);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&definitions);
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran(cmLocalUnixMakefileGenerator3* lg)
  : cmDepends(lg)
  , Internal(new cmDependsFortranInternals)
{
  // Configure the include file search path.
  this->SetIncludePathFromLanguage("Fortran");

  // Get the list of definitions.
  std::vector<std::string> definitions;
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  mf->GetDefExpandList("CMAKE_TARGET_DEFINITIONS_Fortran", definitions);

  // translate i.e. FOO=BAR to FOO and add it to the list of defined
  // preprocessor symbols
  for (std::string def : definitions) {
    std::string::size_type assignment = def.find('=');
    if (assignment != std::string::npos) {
      def = def.substr(0, assignment);
    }
    this->PPDefinitions.insert(def);
  }

  this->CompilerId = mf->GetSafeDefinition("CMAKE_Fortran_COMPILER_ID");
  this->SModSep = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
  this->SModExt = mf->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
}